

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dokick.c
# Opt level: O2

void impact_drop(obj *missile,xchar x,xchar y,xchar dlev)

{
  obj *poVar1;
  level *lev;
  schar loc;
  boolean bVar2;
  boolean bVar3;
  int iVar4;
  char *pcVar5;
  monst *pmVar6;
  char *pcVar7;
  xchar y_00;
  int iVar8;
  undefined7 in_register_00000011;
  obj *obj;
  char cVar9;
  long lVar10;
  undefined7 in_register_00000031;
  long lVar11;
  char *pcVar12;
  long lVar13;
  long amount;
  long lVar14;
  long lVar15;
  bool bVar16;
  bool peaceful;
  byte local_8a;
  coord local_82;
  monst *local_80;
  int local_78;
  int local_74;
  long local_70;
  long local_68;
  int local_60;
  int local_5c;
  long local_58;
  long local_50;
  long local_48;
  char *local_40;
  long local_38;
  
  local_38 = (long)(int)CONCAT71(in_register_00000031,x);
  local_80 = (monst *)(local_38 * 0xa8);
  local_68 = (long)(int)CONCAT71(in_register_00000011,y);
  if (level->objects[local_38][local_68] != (obj *)0x0) {
    loc = down_gate(x,y);
    drop_to(&local_82,loc);
    if (local_82.y != '\0') {
      bVar16 = dlev == '\0';
      if (bVar16) {
        dlev = local_82.y;
      }
      cVar9 = '\t';
      if (bVar16) {
        cVar9 = loc;
      }
      bVar2 = costly_spot(x,y);
      lev = level;
      local_74 = (int)y;
      if (bVar2 == '\0') {
        lVar11 = 0;
        lVar13 = 0;
        local_8a = 1;
        pmVar6 = (monst *)0x0;
      }
      else {
        pcVar5 = in_rooms(level,x,y,0x12);
        pmVar6 = shop_keeper(lev,*pcVar5);
        if (pmVar6 == (monst *)0x0) {
          lVar11 = 0;
          lVar13 = 0;
          local_8a = 1;
          pmVar6 = (monst *)0x0;
        }
        else {
          lVar11 = (long)*(int *)&pmVar6[0x1b].field_0x60;
          iVar8._0_1_ = pmVar6[0x1b].mtame;
          iVar8._1_1_ = pmVar6[0x1b].m_ap_type;
          iVar8._2_1_ = pmVar6[0x1b].mfrozen;
          iVar8._3_1_ = pmVar6[0x1b].mblinded;
          lVar13 = (long)iVar8;
          local_8a = (pmVar6->field_0x62 & 0x40) >> 6;
        }
      }
      bVar16 = true;
      if (missile != (obj *)0x0) {
        bVar16 = missile->otyp != 0x213;
      }
      iVar8 = (int)cVar9;
      lVar14 = 0;
      local_5c = (int)local_82.x;
      local_60 = (int)dlev;
      local_40 = u.urooms;
      lVar10 = 0;
      poVar1 = *(obj **)((long)level->objects[0] + local_68 * 8 + (long)local_80);
      local_80 = pmVar6;
      lVar15 = local_68;
      amount = 0;
LAB_0017843b:
      obj = poVar1;
      pmVar6 = local_80;
      if (obj != (obj *)0x0) {
        poVar1 = (obj->v).v_nexthere;
        if (((obj != missile) && (lVar10 = lVar10 + obj->quan, obj != uball)) &&
           ((obj != uchain && (((obj->field_0x4b & 0x20) == 0 || ((ushort)(obj->otyp - 0xdaU) < 3)))
            ))) {
          if (bVar16) {
            iVar4 = 3;
            if (obj->otyp == 0x214) {
              iVar4 = 0x1e;
            }
          }
          else {
            iVar4 = 3;
            if (obj->otyp == 0x214) goto LAB_0017843b;
          }
          local_78 = iVar8;
          local_58 = lVar14;
          local_50 = lVar11;
          local_48 = lVar13;
          iVar4 = rn2(iVar4);
          lVar11 = local_50;
          lVar13 = local_48;
          lVar14 = local_58;
          iVar8 = local_78;
          if (iVar4 == 0) {
            obj_extract_self(obj);
            lVar11 = amount;
            if (bVar2 != '\0') {
              bVar3 = costly_spot(u.ux,u.uy);
              y_00 = (xchar)local_74;
              if (bVar3 == '\0') {
                peaceful = false;
              }
              else {
                pcVar5 = in_rooms(level,x,y_00,0x12);
                pcVar5 = strchr(local_40,(int)*pcVar5);
                peaceful = pcVar5 != (char *)0x0;
                lVar15 = local_68;
              }
              local_70 = stolen_value(obj,x,y_00,peaceful,'\x01');
              if (obj->cobj != (obj *)0x0) {
                picked_container(obj);
              }
              lVar11 = local_70 + amount;
              if (obj->oclass != '\f') {
                obj->field_0x4a = obj->field_0x4a & 0xf7;
              }
            }
            local_70 = lVar11;
            iVar8 = local_78;
            deliver_object(obj,(xchar)local_5c,(xchar)local_60,local_78);
            lVar14 = local_58 + obj->quan;
            lVar11 = local_50;
            lVar13 = local_48;
            amount = local_70;
          }
        }
        goto LAB_0017843b;
      }
      if ((lVar14 != 0) && ((viz_array[lVar15][local_38] & 2U) != 0)) {
        pcVar5 = "object falls";
        if (lVar14 != 1) {
          pcVar5 = "objects fall";
        }
        if (missile == (obj *)0x0) {
          if (lVar10 == lVar14) {
            pcVar7 = "All the";
            if (lVar14 == 1) {
              pcVar7 = "The";
            }
          }
          else {
            pcVar7 = "Some of the";
            pcVar5 = "objects fall";
            if (lVar14 == 1) {
              pcVar7 = "One of the";
              pcVar5 = "objects falls";
            }
          }
          pline("%s adjacent %s %s.",pcVar7,pcVar5,gate_str);
        }
        else {
          pcVar7 = "";
          if (lVar14 == 1) {
            pcVar7 = "an";
          }
          pcVar12 = "the ";
          if (lVar14 != lVar10) {
            pcVar12 = pcVar7;
          }
          pline("From the impact, %sother %s.",pcVar12,pcVar5);
        }
      }
      if (((bVar2 != '\0') && (pmVar6 != (monst *)0x0)) && (amount != 0)) {
        iVar4._0_1_ = pmVar6[0x1b].mtame;
        iVar4._1_1_ = pmVar6[0x1b].m_ap_type;
        iVar4._2_1_ = pmVar6[0x1b].mfrozen;
        iVar4._3_1_ = pmVar6[0x1b].mblinded;
        if (lVar13 < iVar4) {
          pcVar5 = currency(amount);
          pline("You removed %ld %s worth of goods!",amount,pcVar5);
          if ((viz_array[pmVar6->my][pmVar6->mx] & 2U) == 0) {
            You_hear("a scream, \"Thief!\"");
          }
          else {
            if (pmVar6[0x1b].field_0x75 == '\0') {
              strncpy(&pmVar6[0x1b].field_0x75,plname,0x20);
            }
            if (local_8a == 0) {
              pcVar5 = Monnam(pmVar6);
              pcVar7 = "%s is infuriated!";
            }
            else {
              pcVar7 = "\"%s, you are a thief!\"";
              pcVar5 = plname;
            }
            pline(pcVar7,pcVar5);
          }
          hot_pursuit(pmVar6);
          angry_guards('\0');
          return;
        }
        lVar13 = *(int *)&pmVar6[0x1b].field_0x60 - lVar11;
        if (lVar13 != 0 && lVar11 <= *(int *)&pmVar6[0x1b].field_0x60) {
          pcVar5 = Monnam(pmVar6);
          pcVar7 = currency(lVar13);
          pline("You owe %s %ld %s for goods lost.",pcVar5,lVar13,pcVar7);
          return;
        }
      }
    }
  }
  return;
}

Assistant:

void impact_drop(struct obj *missile, xchar x, xchar y, xchar dlev)
{
	schar toloc;
	struct obj *obj, *obj2;
	struct monst *shkp;
	long oct, dct, price, debit, robbed;
	boolean angry, costly, isrock;
	coord cc;

	if (!OBJ_AT(x, y)) return;

	toloc = down_gate(x, y);
	drop_to(&cc, toloc);
	if (!cc.y) return;

	if (dlev) {
		/* send objects next to player falling through trap door.
		 * checked in obj_delivery().
		 */
		toloc = MIGR_NEAR_PLAYER;
		cc.y = dlev;
	}

	costly = costly_spot(x, y);
	price = debit = robbed = 0L;
	angry = FALSE;
	shkp = NULL;
	/* if 'costly', we must keep a record of ESHK(shkp) before
	 * it undergoes changes through the calls to stolen_value.
	 * the angry bit must be reset, if needed, in this fn, since
	 * stolen_value is called under the 'silent' flag to avoid
	 * unsavory pline repetitions.
	 */
	if (costly) {
	    if ((shkp = shop_keeper(level, *in_rooms(level, x, y, SHOPBASE))) != 0) {
		debit	= ESHK(shkp)->debit;
		robbed	= ESHK(shkp)->robbed;
		angry	= !shkp->mpeaceful;
	    }
	}

	isrock = (missile && missile->otyp == ROCK);
	oct = dct = 0L;
	for (obj = level->objects[x][y]; obj; obj = obj2) {
		obj2 = obj->nexthere;
		if (obj == missile) continue;
		/* number of objects in the pile */
		oct += obj->quan;
		if (obj == uball || obj == uchain) continue;
		/* level prizes never fall */
		if (Is_prize(obj)) continue;
		/* boulders can fall too, but rarely & never due to rocks */
		if ((isrock && obj->otyp == BOULDER) ||
		   rn2(obj->otyp == BOULDER ? 30 : 3)) continue;
		obj_extract_self(obj);

		if (costly) {
		    price += stolen_value(obj, x, y,
				(costly_spot(u.ux, u.uy) &&
				 strchr(u.urooms, *in_rooms(level, x, y, SHOPBASE))),
				TRUE);
		    /* set obj->no_charge to 0 */
		    if (Has_contents(obj))
			picked_container(obj);	/* does the right thing */
		    if (obj->oclass != COIN_CLASS)
			obj->no_charge = 0;
		}

		deliver_object(obj, cc.x, cc.y, toloc);

		/* number of fallen objects */
		dct += obj->quan;
	}

	if (dct && cansee(x,y)) {	/* at least one object fell */
	    const char *what = (dct == 1L ? "object falls" : "objects fall");

	    if (missile)
		pline("From the impact, %sother %s.",
		      dct == oct ? "the " : dct == 1L ? "an" : "", what);
	    else if (oct == dct)
		pline("%s adjacent %s %s.",
		      dct == 1L ? "The" : "All the", what, gate_str);
	    else
		pline("%s adjacent %s %s.",
		      dct == 1L ? "One of the" : "Some of the",
		      dct == 1L ? "objects falls" : what, gate_str);
	}

	if (costly && shkp && price) {
		if (ESHK(shkp)->robbed > robbed) {
		    pline("You removed %ld %s worth of goods!", price, currency(price));
		    if (cansee(shkp->mx, shkp->my)) {
			if (ESHK(shkp)->customer[0] == 0)
			    strncpy(ESHK(shkp)->customer,
					   plname, PL_NSIZ);
			if (angry)
			    pline("%s is infuriated!", Monnam(shkp));
			else pline("\"%s, you are a thief!\"", plname);
		    } else  You_hear("a scream, \"Thief!\"");
		    hot_pursuit(shkp);
		    angry_guards(FALSE);
		    return;
		}
		if (ESHK(shkp)->debit > debit) {
		    long amt = (ESHK(shkp)->debit - debit);
		    pline("You owe %s %ld %s for goods lost.",
			Monnam(shkp),
			amt, currency(amt));
		}
	}

}